

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  reference pvVar3;
  ostream *poVar4;
  runtime_error *this;
  unique_ptr<Player,_std::default_delete<Player>_> local_1a0;
  unique_ptr<Player,_std::default_delete<Player>_> local_198;
  undefined1 local_190 [8];
  Game game;
  string local_120 [32];
  undefined1 local_100 [16];
  string local_f0 [32];
  undefined1 local_d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined4 local_9c;
  undefined1 local_98 [28];
  int index;
  int i;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_69;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  unique_ptr<Player,_std::default_delete<Player>_> black;
  unique_ptr<Player,_std::default_delete<Player>_> white;
  string turns;
  bool walk_through;
  char **argv_local;
  int argc_local;
  
  turns.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&white);
  std::unique_ptr<Player,std::default_delete<Player>>::unique_ptr<std::default_delete<Player>,void>
            ((unique_ptr<Player,std::default_delete<Player>> *)&black);
  std::unique_ptr<Player,std::default_delete<Player>>::unique_ptr<std::default_delete<Player>,void>
            ((unique_ptr<Player,std::default_delete<Player>> *)
             &arguments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_69);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68,(long)(argc + -1),&local_69);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_69);
  for (local_98._24_4_ = 1; (int)local_98._24_4_ < argc; local_98._24_4_ = local_98._24_4_ + 1) {
    pcVar1 = argv[(int)local_98._24_4_];
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68,(long)(local_98._24_4_ + -1));
    std::__cxx11::string::operator=((string *)pvVar3,pcVar1);
  }
  local_98._20_4_ = 0;
  do {
    if (argc + -1 <= (int)local_98._20_4_) {
      bVar2 = std::operator==(&black,(nullptr_t)0x0);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_f0,"local",(allocator<char> *)(local_100 + 0xf));
        create_player((string *)local_d0);
        std::unique_ptr<Player,_std::default_delete<Player>_>::operator=
                  (&black,(unique_ptr<Player,_std::default_delete<Player>_> *)local_d0);
        std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr
                  ((unique_ptr<Player,_std::default_delete<Player>_> *)local_d0);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0xf));
      }
      bVar2 = std::operator==((unique_ptr<Player,_std::default_delete<Player>_> *)
                              &arguments.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_120,"local",
                   (allocator<char> *)
                   ((long)&game.m_black_player._M_t.
                           super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
                           super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
                           super__Head_base<0UL,_Player_*,_false> + 7));
        create_player((string *)local_100);
        std::unique_ptr<Player,_std::default_delete<Player>_>::operator=
                  ((unique_ptr<Player,_std::default_delete<Player>_> *)
                   &arguments.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (unique_ptr<Player,_std::default_delete<Player>_> *)local_100);
        std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr
                  ((unique_ptr<Player,_std::default_delete<Player>_> *)local_100);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&game.m_black_player._M_t.
                           super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
                           super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
                           super__Head_base<0UL,_Player_*,_false> + 7));
      }
      std::unique_ptr<Player,_std::default_delete<Player>_>::unique_ptr(&local_198,&black);
      std::unique_ptr<Player,_std::default_delete<Player>_>::unique_ptr
                (&local_1a0,
                 (unique_ptr<Player,_std::default_delete<Player>_> *)
                 &arguments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Game::Game((Game *)local_190,&local_198,&local_1a0,(bool)turns.field_2._M_local_buf[0xf],
                 (string *)&white);
      std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr(&local_1a0);
      std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr(&local_198);
      Game::play_game((Game *)local_190);
      local_9c = 1;
      Game::~Game((Game *)local_190);
LAB_00105d34:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
      std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr
                ((unique_ptr<Player,_std::default_delete<Player>_> *)
                 &arguments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr(&black);
      std::__cxx11::string::~string((string *)&white);
      return 0;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68,(long)(int)local_98._20_4_);
    bVar2 = std::operator==(pvVar3,"--white");
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68,(long)(local_98._20_4_ + 1));
      create_player((string *)(local_98 + 8));
      std::unique_ptr<Player,_std::default_delete<Player>_>::operator=
                (&black,(unique_ptr<Player,_std::default_delete<Player>_> *)(local_98 + 8));
      std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr
                ((unique_ptr<Player,_std::default_delete<Player>_> *)(local_98 + 8));
      local_98._20_4_ = local_98._20_4_ + 1;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,(long)(int)local_98._20_4_);
      bVar2 = std::operator==(pvVar3,"--black");
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68,(long)(local_98._20_4_ + 1));
        create_player((string *)local_98);
        std::unique_ptr<Player,_std::default_delete<Player>_>::operator=
                  ((unique_ptr<Player,_std::default_delete<Player>_> *)
                   &arguments.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (unique_ptr<Player,_std::default_delete<Player>_> *)local_98);
        std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr
                  ((unique_ptr<Player,_std::default_delete<Player>_> *)local_98);
        local_98._20_4_ = local_98._20_4_ + 1;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,(long)(int)local_98._20_4_);
        bVar2 = std::operator==(pvVar3,"--turns");
        if (bVar2) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,(long)(local_98._20_4_ + 1));
          std::__cxx11::string::operator=((string *)&white,(string *)pvVar3);
          local_98._20_4_ = local_98._20_4_ + 1;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,(long)(int)local_98._20_4_);
          bVar2 = std::operator==(pvVar3,"--walk-through");
          if (!bVar2) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,(long)(int)local_98._20_4_);
            bVar2 = std::operator==(pvVar3,"-h");
            if (!bVar2) {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_68,(long)(int)local_98._20_4_);
              bVar2 = std::operator==(pvVar3,"--help");
              if (!bVar2) {
                local_d0[0xf] = 1;
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_68,(long)(int)local_98._20_4_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_d0 + 0x10),"Unknown argument ",pvVar3);
                std::runtime_error::runtime_error(this,(string *)(local_d0 + 0x10));
                local_d0[0xf] = 0;
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
            }
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                                    );
            poVar4 = std::operator<<(poVar4," [--turns [e2e4 ...]] [--walk-through]");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            local_9c = 1;
            goto LAB_00105d34;
          }
          turns.field_2._M_local_buf[0xf] = '\x01';
        }
      }
    }
    local_98._20_4_ = local_98._20_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    // Set default game settings.
    bool walk_through = false;
    string turns;
    unique_ptr<Player> white;
    unique_ptr<Player> black;

    // Parse arguments.
    vector<string> arguments(argc - 1);
    for (int i = 1; i < argc; i++) {
        arguments[i - 1] = argv[i];
    }
    for (int index = 0; index < argc - 1; index++) {
        if (arguments[index] == "--white") {
            // White player definition.
            white = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--black") {
            // Black player definition.
            black = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--turns") {
            // Pre turns definition.
            turns = arguments[index + 1];
            index++;
        } else if (arguments[index] == "--walk-through") {
            // Walk through pre turns.
            walk_through = true;
        } else if ((arguments[index] == "-h") || (arguments[index] == "--help")) {
            // Display help.
            cout << "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                 << " [--turns [e2e4 ...]] [--walk-through]" << endl;
            return 0;
        } else {
            // Unknown argument.
            throw runtime_error("Unknown argument " + arguments[index]);
        }
    }

    // Fallback default players if not specified.
    if (white == nullptr) {
        white = create_player("local");
    }
    if (black == nullptr) {
        black = create_player("local");
    }

    // Initialize the game.
    Game game(move(white), move(black), walk_through, turns);

    // Play.
    game.play_game();

    return 0;
}